

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_law_compression.cc
# Opt level: O3

void __thiscall
sptk::MuLawCompression::MuLawCompression
          (MuLawCompression *this,double abs_max_value,double compression_factor)

{
  double dVar1;
  
  this->_vptr_MuLawCompression = (_func_int **)&PTR__MuLawCompression_0010fcc8;
  this->abs_max_value_ = abs_max_value;
  this->compression_factor_ = compression_factor;
  dVar1 = log1p(compression_factor);
  this->constant_ = abs_max_value / dVar1;
  this->is_valid_ = (bool)(-(0.0 < this->compression_factor_) & -(0.0 < this->abs_max_value_) & 1);
  return;
}

Assistant:

MuLawCompression::MuLawCompression(double abs_max_value,
                                   double compression_factor)
    : abs_max_value_(abs_max_value),
      compression_factor_(compression_factor),
      constant_(abs_max_value_ / std::log1p(compression_factor_)),
      is_valid_(true) {
  if (abs_max_value_ <= 0.0 || compression_factor_ <= 0.0) {
    is_valid_ = false;
    return;
  }
}